

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui.cc
# Opt level: O3

bool handle_anylevel_key(TUI_context *ctx,int key)

{
  if (key < 0x71) {
    if ((key != 3) && (key != 0x51)) {
      return false;
    }
  }
  else {
    if (key == 0x19a) {
      resize_term(0,0);
      erase();
      setup_display(ctx);
      return true;
    }
    if (key != 0x71) {
      return false;
    }
  }
  ctx->quit = true;
  return true;
}

Assistant:

static bool handle_anylevel_key(TUI_context &ctx, int key)
{
    switch (key) {
    default:
        return false;
    case 'q': case 'Q':
    case 3:   // console break
        ctx.quit = true;
        return true;
    case KEY_RESIZE:
        resize_term(0, 0);
        erase();
        setup_display(ctx);
        return true;
    }
}